

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FirewirePort.cpp
# Opt level: O0

bool __thiscall FirewirePort::WriteBroadcastReadRequest(FirewirePort *this,uint seq)

{
  bool bVar1;
  uint uVar2;
  undefined8 local_20;
  nodeaddr_t bcReqAddr;
  quadlet_t bcReqData;
  uint seq_local;
  FirewirePort *this_local;
  
  if (((this->super_BasePort).IsAllBoardsRev4_5_ & 1U) == 0) {
    bVar1 = BasePort::IsBroadcastShorterWait(&this->super_BasePort);
    if (!bVar1) {
      uVar2 = (1 << ((byte)(this->super_BasePort).NumOfNodes_ & 0x1f)) - 1;
      goto LAB_001155be;
    }
  }
  uVar2 = (this->super_BasePort).BoardInUseMask_;
LAB_001155be:
  bcReqAddr._0_4_ = uVar2 + seq * 0x10000;
  if (((this->super_BasePort).IsAllBoardsRev4_6_ & 1U) == 0) {
    local_20 = 0x1800;
  }
  else {
    local_20 = 0xffffffff000f;
  }
  (*(this->super_BasePort)._vptr_BasePort[5])(this,0,local_20,(ulong)(uint)bcReqAddr);
  return true;
}

Assistant:

bool FirewirePort::WriteBroadcastReadRequest(unsigned int seq)
{
    quadlet_t bcReqData = (seq << 16);
    if (IsAllBoardsRev4_5_ || IsBroadcastShorterWait())
        bcReqData += BoardInUseMask_;
    else
        // For a mixed set of boards, disable the shorter wait capability by "tricking" the system into thinking
        // that all nodes are used in this configuration. Otherwise, boards with the shorter wait capability may
        // attempt to transmit at the same time as boards that do not have this capability. The FireWire bus
        // arbitration protocol should prevent disaster, but this could lead to lower efficiency.
        bcReqData += ((1 << NumOfNodes_)-1);

    nodeaddr_t bcReqAddr;
    if (IsAllBoardsRev4_6_)
        bcReqAddr = 0xffffffff000f;      // special address to trigger broadcast read
    else
        bcReqAddr = 0x1800;              // special address to trigger broadcast read

#if 1
    WriteQuadletNode(0, bcReqAddr, bcReqData);
    // WriteQuadletNode returns false because the "fake" broadcast packet to node 0 does not
    // return an ACK.
    return true;
#else
    return WriteQuadlet(FW_NODE_BROADCAST, bcReqAddr, bcReqData);
#endif
}